

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O2

void __thiscall
BMRS_XZ<UFPC>::PerformLabelingMem
          (BMRS_XZ<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  Data_Compressed *pDVar1;
  int *piVar2;
  undefined8 uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  int _width;
  Mat1b *pMVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  pointer puVar12;
  pointer piVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  Run *pRVar15;
  int iVar16;
  int k;
  long lVar17;
  long lVar18;
  Run *pRVar19;
  long lVar20;
  void *__child_stack;
  int j;
  ulong uVar21;
  int iVar22;
  uint _height;
  uint64_t *puVar23;
  uint uVar24;
  uint64_t *puVar25;
  ulong uVar26;
  void *__arg;
  uint64_t *puVar27;
  uint64_t *puVar28;
  uint64_t *puVar29;
  int j_2;
  long lVar30;
  ulong uVar31;
  double dVar32;
  allocator_type local_349;
  ulong local_348;
  long local_340;
  ulong local_338;
  ulong local_330;
  BMRS_XZ<UFPC> *local_328;
  ulong local_320;
  int local_314;
  Data_Compressed *local_310;
  Data_Compressed *local_308;
  ulong local_300;
  long local_2f8;
  ulong local_2f0;
  Runs *local_2e8;
  Data_Compressed *local_2e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  Run *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  MemMat<int> img_labels;
  value_type_conflict3 local_1c8;
  Size local_1c0;
  Mat_<int> local_1b8;
  MemMat<unsigned_char> img;
  Mat local_90 [96];
  
  local_2d8 = accesses;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar3 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_1c0.height = (int)uVar3;
  local_1c0.width = (int)((ulong)uVar3 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_1c0,0);
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar6 = *(uint *)&pMVar7->field_0x8;
  _width = *(int *)&pMVar7->field_0xc;
  pDVar1 = &this->data_compressed;
  Data_Compressed::Alloc(pDVar1,uVar6,_width);
  local_308 = pDVar1;
  InitCompressedDataMem(this,pDVar1,&img);
  uVar21 = (long)(int)uVar6 / 2;
  uVar26 = (long)(int)uVar6 % 2;
  local_300 = uVar26 & 0xffffffff;
  iVar22 = (int)uVar21;
  _height = iVar22 + (int)uVar26;
  local_338 = (ulong)_height;
  uVar24 = (this->data_compressed).data_width;
  local_310 = &this->data_merged;
  local_348 = (ulong)uVar6;
  Data_Compressed::Alloc(local_310,_height,_width);
  local_2f8 = (long)_width;
  local_340 = (long)(int)local_348;
  puVar23 = (this->data_compressed).bits;
  puVar25 = (this->data_merged).bits;
  lVar17 = (long)(this->data_compressed).data_width;
  lVar20 = (long)(this->data_merged).data_width;
  uVar26 = 0;
  uVar31 = 0;
  if (0 < (int)uVar24) {
    uVar31 = (ulong)uVar24;
  }
  local_2d0 = 0;
  if (0 < iVar22) {
    local_2d0 = uVar21 & 0xffffffff;
  }
  puVar27 = puVar23 + lVar17;
  for (; uVar26 != local_2d0; uVar26 = uVar26 + 1) {
    for (uVar21 = 0; uVar31 != uVar21; uVar21 = uVar21 + 1) {
      puVar25[uVar21] = puVar27[uVar21] | puVar23[uVar21];
    }
    puVar25 = puVar25 + lVar20;
    puVar27 = puVar27 + lVar17 * 2;
    puVar23 = puVar23 + lVar17 * 2;
  }
  if ((int)local_300 != 0) {
    puVar23 = local_308->bits;
    puVar25 = local_310->bits;
    for (uVar21 = 0; uVar31 != uVar21; uVar21 = uVar21 + 1) {
      puVar25[lVar20 * iVar22 + uVar21] = puVar23[lVar17 * ((int)local_348 + -1) + uVar21];
    }
  }
  local_2e0 = &this->data_flags;
  local_328 = this;
  Data_Compressed::Alloc(local_2e0,(int)local_338 + -1,_width);
  uVar6 = (this->data_flags).height;
  puVar23 = (this->data_compressed).bits;
  puVar25 = (this->data_flags).bits;
  lVar17 = (long)(this->data_compressed).data_width;
  uVar21 = 0;
  local_330 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    local_330 = uVar21;
  }
  lVar20 = (long)(this->data_flags).data_width;
  puVar27 = puVar23 + lVar17;
  local_320 = lVar20 * 8;
  puVar29 = puVar25;
  puVar28 = puVar23;
  for (; puVar28 = puVar28 + lVar17 * 2, uVar21 != local_330; uVar21 = uVar21 + 1) {
    puVar25[uVar21 * lVar20] =
         (puVar23[(uVar21 * 2 + 2) * lVar17] * 2 | puVar23[(uVar21 * 2 + 2) * lVar17]) &
         (puVar23[(uVar21 * 2 + 1) * lVar17] * 2 | puVar23[(uVar21 * 2 + 1) * lVar17]);
    for (lVar30 = 1; lVar30 < (int)uVar24; lVar30 = lVar30 + 1) {
      puVar29[lVar30] =
           (puVar28[lVar30 + -1] >> 0x3f | puVar28[lVar30] << 1 | puVar28[lVar30]) &
           (puVar27[lVar30 + -1] >> 0x3f | puVar27[lVar30] << 1 | puVar27[lVar30]);
    }
    puVar27 = puVar27 + lVar17 * 2;
    puVar29 = puVar29 + lVar20;
    this = local_328;
  }
  local_2e8 = &this->data_runs;
  Runs::Alloc(local_2e8,(int)local_348,_width);
  uVar3 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::MemAlloc((((int)((ulong)uVar3 >> 0x20) + 1) / 2) * (((int)uVar3 + 1) / 2) + 1);
  UFPC::MemSetup();
  __arg = (void *)(ulong)uVar24;
  FindRunsMem(this,(this->data_merged).bits,(this->data_flags).bits,(int)local_338,uVar24,
              (this->data_runs).runs);
  pRVar19 = (this->data_runs).runs;
  lVar17 = 1;
  lVar20 = 0;
  uVar21 = 0;
  while (uVar26 = uVar21,
        piVar13 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
        puVar12 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start, uVar26 != local_2d0) {
    local_2b8 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_2c0 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    iVar22 = 0;
    pRVar15 = pRVar19;
    do {
      pRVar19 = pRVar15;
      uVar4 = pRVar19->start_pos;
      local_2f0 = (ulong)uVar4;
      if (local_2f0 == 0xffff) {
        lVar18 = (long)iVar22;
        for (lVar30 = lVar18; lVar30 < local_2f8; lVar30 = lVar30 + 1) {
          piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar20 +
                           img_labels.accesses_._16_8_ + lVar30 * 4);
          *piVar2 = *piVar2 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * lVar20 + img_labels.img_._16_8_ + lVar30 * 4) = 0;
        }
        for (; lVar18 < local_2f8; lVar18 = lVar18 + 1) {
          piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar17 +
                           img_labels.accesses_._16_8_ + lVar18 * 4);
          *piVar2 = *piVar2 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * lVar17 + img_labels.img_._16_8_ + lVar18 * 4) = 0;
        }
        pRVar19 = pRVar19 + 1;
        __arg = (void *)img_labels.img_._16_8_;
        iVar16 = iVar22;
      }
      else {
        local_320 = (ulong)pRVar19->end_pos;
        uVar6 = pRVar19->label;
        piVar2 = piVar13 + (int)uVar6;
        *piVar2 = *piVar2 + 1;
        uVar6 = puVar12[(int)uVar6];
        local_348 = CONCAT44(local_348._4_4_,uVar6);
        lVar30 = 0;
        local_330 = (ulong)iVar22;
        for (uVar21 = local_330; (long)uVar21 < (long)local_2f0; uVar21 = uVar21 + 1) {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar2 = (int *)(lVar20 * lVar18 + img_labels.accesses_._16_8_ + uVar21 * 4);
          *piVar2 = *piVar2 + 1;
          lVar8 = *(long *)img_labels.img_._72_8_;
          *(undefined4 *)(lVar20 * lVar8 + img_labels.img_._16_8_ + uVar21 * 4) = 0;
          piVar2 = (int *)(lVar18 * lVar17 + img_labels.accesses_._16_8_ + uVar21 * 4);
          *piVar2 = *piVar2 + 1;
          *(undefined4 *)(lVar8 * lVar17 + img_labels.img_._16_8_ + uVar21 * 4) = 0;
          lVar30 = lVar30 + 1;
        }
        local_338 = img.img_._72_8_;
        local_298 = img.accesses_._72_8_;
        local_2a0 = img_labels.img_._72_8_;
        local_2a8 = img_labels.accesses_._72_8_;
        lVar18 = local_330 * 4;
        __arg = (void *)(img_labels.img_._16_8_ + lVar18);
        for (; (long)(local_330 + lVar30) < (long)local_320; lVar30 = lVar30 + 1) {
          lVar8 = *(long *)img.accesses_._72_8_;
          piVar2 = (int *)(lVar20 * lVar8 + img.accesses_._16_8_ + lVar18 + lVar30 * 4);
          *piVar2 = *piVar2 + 1;
          lVar9 = *(long *)img.img_._72_8_;
          lVar10 = *(long *)img_labels.accesses_._72_8_;
          uVar24 = uVar6;
          if (*(char *)(lVar30 + lVar20 * lVar9 + img.img_._16_8_ + local_330) == '\0') {
            uVar24 = 0;
          }
          piVar2 = (int *)(lVar20 * lVar10 + lVar18 + img_labels.accesses_._16_8_ + lVar30 * 4);
          *piVar2 = *piVar2 + 1;
          lVar11 = *(long *)img_labels.img_._72_8_;
          *(uint *)((long)__arg + lVar30 * 4 + lVar20 * lVar11) = uVar24;
          piVar2 = (int *)(lVar8 * lVar17 + img.accesses_._16_8_ + lVar18 + lVar30 * 4);
          *piVar2 = *piVar2 + 1;
          uVar24 = uVar6;
          if (*(char *)(lVar30 + lVar9 * lVar17 + img.img_._16_8_ + local_330) == '\0') {
            uVar24 = 0;
          }
          piVar2 = (int *)(lVar10 * lVar17 + lVar18 + img_labels.accesses_._16_8_ + lVar30 * 4);
          *piVar2 = *piVar2 + 1;
          *(uint *)((long)__arg + lVar30 * 4 + lVar11 * lVar17) = uVar24;
        }
        iVar16 = iVar22 + (int)lVar30;
        local_314 = iVar22;
        local_2b0 = pRVar19;
      }
      iVar22 = iVar16;
      pRVar15 = pRVar19 + 1;
    } while (uVar4 != 0xffff);
    lVar20 = lVar20 + 2;
    lVar17 = lVar17 + 2;
    local_2c8 = uVar26;
    uVar21 = uVar26 + 1;
  }
  if ((int)local_300 != 0) {
    local_340 = local_340 + -1;
    uVar21 = 0;
    do {
      uVar4 = pRVar19->start_pos;
      uVar26 = (ulong)uVar4;
      if (uVar26 == 0xffff) {
        lVar17 = (long)(int)uVar21 * 4;
        for (uVar26 = uVar21 & 0xffffffff; __arg = (void *)img_labels.accesses_._72_8_,
            (int)uVar26 < _width; uVar26 = (ulong)((int)uVar26 + 1)) {
          piVar2 = (int *)(img_labels.accesses_._16_8_ + lVar17 +
                          *(long *)img_labels.accesses_._72_8_ * local_340);
          *piVar2 = *piVar2 + 1;
          *(undefined4 *)
           (lVar17 + img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * local_340) = 0;
        }
      }
      else {
        uVar5 = pRVar19->end_pos;
        uVar6 = pRVar19->label;
        piVar2 = piVar13 + (int)uVar6;
        *piVar2 = *piVar2 + 1;
        uVar6 = puVar12[(int)uVar6];
        for (lVar17 = (long)(int)uVar21; lVar17 < (long)uVar26; lVar17 = lVar17 + 1) {
          piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * local_340 +
                           img_labels.accesses_._16_8_ + lVar17 * 4);
          *piVar2 = *piVar2 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * local_340 + img_labels.img_._16_8_ + lVar17 * 4) = 0;
        }
        for (; uVar21 = uVar26, __arg = (void *)(ulong)uVar6, uVar26 < uVar5; uVar26 = uVar26 + 1) {
          piVar2 = (int *)(*(long *)img_labels.accesses_._72_8_ * local_340 +
                           img_labels.accesses_._16_8_ + uVar26 * 4);
          *piVar2 = *piVar2 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * local_340 + img_labels.img_._16_8_ +
                   uVar26 * 4) = uVar6;
        }
      }
      pRVar19 = pRVar19 + 1;
    } while (uVar4 != 0xffff);
  }
  local_1c8 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8,4,&local_1c8,
             &local_349);
  pvVar14 = local_2d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_2d8,&local_1b8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8);
  dVar32 = MemMat<unsigned_char>::GetTotalAccesses(&img);
  *(pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)(dVar32 - 9.223372036854776e+18) & (long)dVar32 >> 0x3f | (long)dVar32;
  dVar32 = MemMat<int>::GetTotalAccesses(&img_labels);
  (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)dVar32 >> 0x3f & (long)(dVar32 - 9.223372036854776e+18) | (long)dVar32;
  dVar32 = UFPC::MemTotalAccesses();
  __child_stack =
       (void *)((long)dVar32 >> 0x3f & (long)(dVar32 - 9.223372036854776e+18) | (long)dVar32);
  (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
  cv::Mat_<int>::clone
            (&local_1b8,(__fn *)&img_labels.img_,__child_stack,
             (int)(long)(dVar32 - 9.223372036854776e+18),__arg);
  pDVar1 = local_308;
  cv::Mat::operator=(&((local_328->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,&local_1b8.super_Mat);
  cv::Mat::~Mat(&local_1b8.super_Mat);
  Runs::Dealloc(local_2e8);
  Data_Compressed::Dealloc(local_2e0);
  Data_Compressed::Dealloc(local_310);
  Data_Compressed::Dealloc(pDVar1);
  MemMat<int>::~MemMat(&img_labels);
  MemMat<unsigned_char>::~MemMat(&img);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            int i_u = 2 * i;
            int i_d = i_u + 1;

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i_u, k) = 0;
                    for (int k = j; k < w; k++) img_labels(i_d, k) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);

                for (; j < start_pos; j++) img_labels(i_u, j) = 0, img_labels(i_d, j) = 0;
                for (; j < end_pos; j++) {
                    img_labels(i_u, j) = img(i_u, j) ? label : 0;
                    img_labels(i_d, j) = img(i_d, j) ? label : 0;
                }
            }
        }
        if (h % 2) {
            int i = h - 1;
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i, j) = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (j = start_pos; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }